

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nested_loop_join_inner.cpp
# Opt level: O3

idx_t duckdb::NestedLoopJoinComparisonSwitch<duckdb::RefineNestedLoopJoin>
                (Vector *left,Vector *right,idx_t left_size,idx_t right_size,idx_t *lpos,idx_t *rpos
                ,SelectionVector *lvector,SelectionVector *rvector,idx_t current_match_count,
                ExpressionType comparison_type)

{
  PhysicalType PVar1;
  idx_t iVar2;
  NotImplementedException *this;
  InternalException *pIVar3;
  string local_40;
  
  switch(comparison_type) {
  case COMPARE_BOUNDARY_START:
    PVar1 = (left->type).physical_type_;
    if (PVar1 < VARCHAR) {
      switch(PVar1) {
      case BOOL:
      case INT8:
        iVar2 = RefineNestedLoopJoin::Operation<signed_char,duckdb::Equals>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
        break;
      case UINT8:
        iVar2 = RefineNestedLoopJoin::Operation<unsigned_char,duckdb::Equals>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
        break;
      case UINT16:
        iVar2 = RefineNestedLoopJoin::Operation<unsigned_short,duckdb::Equals>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
        break;
      case INT16:
        iVar2 = RefineNestedLoopJoin::Operation<short,duckdb::Equals>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
        break;
      case UINT32:
        iVar2 = RefineNestedLoopJoin::Operation<unsigned_int,duckdb::Equals>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
        break;
      case INT32:
        iVar2 = RefineNestedLoopJoin::Operation<int,duckdb::Equals>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
        break;
      case UINT64:
        iVar2 = RefineNestedLoopJoin::Operation<unsigned_long,duckdb::Equals>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
        break;
      case INT64:
        iVar2 = RefineNestedLoopJoin::Operation<long,duckdb::Equals>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
        break;
      default:
switchD_017befa7_caseD_a:
        pIVar3 = (InternalException *)__cxa_allocate_exception(0x10);
        local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_40,"Unimplemented type for join!","");
        InternalException::InternalException(pIVar3,&local_40);
        __cxa_throw(pIVar3,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      case FLOAT:
        iVar2 = RefineNestedLoopJoin::Operation<float,duckdb::Equals>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
        break;
      case DOUBLE:
        iVar2 = RefineNestedLoopJoin::Operation<double,duckdb::Equals>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
        break;
      case INTERVAL:
        iVar2 = RefineNestedLoopJoin::Operation<duckdb::interval_t,duckdb::Equals>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
      }
    }
    else if (PVar1 == VARCHAR) {
      iVar2 = RefineNestedLoopJoin::Operation<duckdb::string_t,duckdb::Equals>
                        (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                         current_match_count);
    }
    else if (PVar1 == UINT128) {
      iVar2 = RefineNestedLoopJoin::Operation<duckdb::uhugeint_t,duckdb::Equals>
                        (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                         current_match_count);
    }
    else {
      if (PVar1 != INT128) goto switchD_017befa7_caseD_a;
      iVar2 = RefineNestedLoopJoin::Operation<duckdb::hugeint_t,duckdb::Equals>
                        (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                         current_match_count);
    }
    break;
  case COMPARE_NOTEQUAL:
    PVar1 = (left->type).physical_type_;
    if (PVar1 < VARCHAR) {
      switch(PVar1) {
      case BOOL:
      case INT8:
        iVar2 = RefineNestedLoopJoin::Operation<signed_char,duckdb::NotEquals>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
        break;
      case UINT8:
        iVar2 = RefineNestedLoopJoin::Operation<unsigned_char,duckdb::NotEquals>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
        break;
      case UINT16:
        iVar2 = RefineNestedLoopJoin::Operation<unsigned_short,duckdb::NotEquals>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
        break;
      case INT16:
        iVar2 = RefineNestedLoopJoin::Operation<short,duckdb::NotEquals>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
        break;
      case UINT32:
        iVar2 = RefineNestedLoopJoin::Operation<unsigned_int,duckdb::NotEquals>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
        break;
      case INT32:
        iVar2 = RefineNestedLoopJoin::Operation<int,duckdb::NotEquals>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
        break;
      case UINT64:
        iVar2 = RefineNestedLoopJoin::Operation<unsigned_long,duckdb::NotEquals>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
        break;
      case INT64:
        iVar2 = RefineNestedLoopJoin::Operation<long,duckdb::NotEquals>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
        break;
      default:
switchD_017bf023_caseD_a:
        pIVar3 = (InternalException *)__cxa_allocate_exception(0x10);
        local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_40,"Unimplemented type for join!","");
        InternalException::InternalException(pIVar3,&local_40);
        __cxa_throw(pIVar3,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      case FLOAT:
        iVar2 = RefineNestedLoopJoin::Operation<float,duckdb::NotEquals>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
        break;
      case DOUBLE:
        iVar2 = RefineNestedLoopJoin::Operation<double,duckdb::NotEquals>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
        break;
      case INTERVAL:
        iVar2 = RefineNestedLoopJoin::Operation<duckdb::interval_t,duckdb::NotEquals>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
      }
    }
    else if (PVar1 == VARCHAR) {
      iVar2 = RefineNestedLoopJoin::Operation<duckdb::string_t,duckdb::NotEquals>
                        (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                         current_match_count);
    }
    else if (PVar1 == UINT128) {
      iVar2 = RefineNestedLoopJoin::Operation<duckdb::uhugeint_t,duckdb::NotEquals>
                        (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                         current_match_count);
    }
    else {
      if (PVar1 != INT128) goto switchD_017bf023_caseD_a;
      iVar2 = RefineNestedLoopJoin::Operation<duckdb::hugeint_t,duckdb::NotEquals>
                        (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                         current_match_count);
    }
    break;
  case COMPARE_LESSTHAN:
    PVar1 = (left->type).physical_type_;
    if (PVar1 < VARCHAR) {
      switch(PVar1) {
      case BOOL:
      case INT8:
        iVar2 = RefineNestedLoopJoin::Operation<signed_char,duckdb::LessThan>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
        break;
      case UINT8:
        iVar2 = RefineNestedLoopJoin::Operation<unsigned_char,duckdb::LessThan>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
        break;
      case UINT16:
        iVar2 = RefineNestedLoopJoin::Operation<unsigned_short,duckdb::LessThan>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
        break;
      case INT16:
        iVar2 = RefineNestedLoopJoin::Operation<short,duckdb::LessThan>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
        break;
      case UINT32:
        iVar2 = RefineNestedLoopJoin::Operation<unsigned_int,duckdb::LessThan>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
        break;
      case INT32:
        iVar2 = RefineNestedLoopJoin::Operation<int,duckdb::LessThan>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
        break;
      case UINT64:
        iVar2 = RefineNestedLoopJoin::Operation<unsigned_long,duckdb::LessThan>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
        break;
      case INT64:
        iVar2 = RefineNestedLoopJoin::Operation<long,duckdb::LessThan>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
        break;
      default:
switchD_017bf09f_caseD_a:
        pIVar3 = (InternalException *)__cxa_allocate_exception(0x10);
        local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_40,"Unimplemented type for join!","");
        InternalException::InternalException(pIVar3,&local_40);
        __cxa_throw(pIVar3,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      case FLOAT:
        iVar2 = RefineNestedLoopJoin::Operation<float,duckdb::LessThan>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
        break;
      case DOUBLE:
        iVar2 = RefineNestedLoopJoin::Operation<double,duckdb::LessThan>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
        break;
      case INTERVAL:
        iVar2 = RefineNestedLoopJoin::Operation<duckdb::interval_t,duckdb::LessThan>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
      }
    }
    else if (PVar1 == VARCHAR) {
      iVar2 = RefineNestedLoopJoin::Operation<duckdb::string_t,duckdb::LessThan>
                        (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                         current_match_count);
    }
    else if (PVar1 == UINT128) {
      iVar2 = RefineNestedLoopJoin::Operation<duckdb::uhugeint_t,duckdb::LessThan>
                        (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                         current_match_count);
    }
    else {
      if (PVar1 != INT128) goto switchD_017bf09f_caseD_a;
      iVar2 = RefineNestedLoopJoin::Operation<duckdb::hugeint_t,duckdb::LessThan>
                        (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                         current_match_count);
    }
    break;
  case COMPARE_GREATERTHAN:
    PVar1 = (left->type).physical_type_;
    if (PVar1 < VARCHAR) {
      switch(PVar1) {
      case BOOL:
      case INT8:
        iVar2 = RefineNestedLoopJoin::Operation<signed_char,duckdb::GreaterThan>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
        break;
      case UINT8:
        iVar2 = RefineNestedLoopJoin::Operation<unsigned_char,duckdb::GreaterThan>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
        break;
      case UINT16:
        iVar2 = RefineNestedLoopJoin::Operation<unsigned_short,duckdb::GreaterThan>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
        break;
      case INT16:
        iVar2 = RefineNestedLoopJoin::Operation<short,duckdb::GreaterThan>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
        break;
      case UINT32:
        iVar2 = RefineNestedLoopJoin::Operation<unsigned_int,duckdb::GreaterThan>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
        break;
      case INT32:
        iVar2 = RefineNestedLoopJoin::Operation<int,duckdb::GreaterThan>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
        break;
      case UINT64:
        iVar2 = RefineNestedLoopJoin::Operation<unsigned_long,duckdb::GreaterThan>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
        break;
      case INT64:
        iVar2 = RefineNestedLoopJoin::Operation<long,duckdb::GreaterThan>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
        break;
      default:
switchD_017bf0dd_caseD_a:
        pIVar3 = (InternalException *)__cxa_allocate_exception(0x10);
        local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_40,"Unimplemented type for join!","");
        InternalException::InternalException(pIVar3,&local_40);
        __cxa_throw(pIVar3,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      case FLOAT:
        iVar2 = RefineNestedLoopJoin::Operation<float,duckdb::GreaterThan>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
        break;
      case DOUBLE:
        iVar2 = RefineNestedLoopJoin::Operation<double,duckdb::GreaterThan>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
        break;
      case INTERVAL:
        iVar2 = RefineNestedLoopJoin::Operation<duckdb::interval_t,duckdb::GreaterThan>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
      }
    }
    else if (PVar1 == VARCHAR) {
      iVar2 = RefineNestedLoopJoin::Operation<duckdb::string_t,duckdb::GreaterThan>
                        (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                         current_match_count);
    }
    else if (PVar1 == UINT128) {
      iVar2 = RefineNestedLoopJoin::Operation<duckdb::uhugeint_t,duckdb::GreaterThan>
                        (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                         current_match_count);
    }
    else {
      if (PVar1 != INT128) goto switchD_017bf0dd_caseD_a;
      iVar2 = RefineNestedLoopJoin::Operation<duckdb::hugeint_t,duckdb::GreaterThan>
                        (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                         current_match_count);
    }
    break;
  case COMPARE_LESSTHANOREQUALTO:
    PVar1 = (left->type).physical_type_;
    if (PVar1 < VARCHAR) {
      switch(PVar1) {
      case BOOL:
      case INT8:
        iVar2 = RefineNestedLoopJoin::Operation<signed_char,duckdb::LessThanEquals>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
        break;
      case UINT8:
        iVar2 = RefineNestedLoopJoin::Operation<unsigned_char,duckdb::LessThanEquals>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
        break;
      case UINT16:
        iVar2 = RefineNestedLoopJoin::Operation<unsigned_short,duckdb::LessThanEquals>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
        break;
      case INT16:
        iVar2 = RefineNestedLoopJoin::Operation<short,duckdb::LessThanEquals>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
        break;
      case UINT32:
        iVar2 = RefineNestedLoopJoin::Operation<unsigned_int,duckdb::LessThanEquals>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
        break;
      case INT32:
        iVar2 = RefineNestedLoopJoin::Operation<int,duckdb::LessThanEquals>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
        break;
      case UINT64:
        iVar2 = RefineNestedLoopJoin::Operation<unsigned_long,duckdb::LessThanEquals>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
        break;
      case INT64:
        iVar2 = RefineNestedLoopJoin::Operation<long,duckdb::LessThanEquals>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
        break;
      default:
switchD_017befe5_caseD_a:
        pIVar3 = (InternalException *)__cxa_allocate_exception(0x10);
        local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_40,"Unimplemented type for join!","");
        InternalException::InternalException(pIVar3,&local_40);
        __cxa_throw(pIVar3,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      case FLOAT:
        iVar2 = RefineNestedLoopJoin::Operation<float,duckdb::LessThanEquals>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
        break;
      case DOUBLE:
        iVar2 = RefineNestedLoopJoin::Operation<double,duckdb::LessThanEquals>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
        break;
      case INTERVAL:
        iVar2 = RefineNestedLoopJoin::Operation<duckdb::interval_t,duckdb::LessThanEquals>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
      }
    }
    else if (PVar1 == VARCHAR) {
      iVar2 = RefineNestedLoopJoin::Operation<duckdb::string_t,duckdb::LessThanEquals>
                        (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                         current_match_count);
    }
    else if (PVar1 == UINT128) {
      iVar2 = RefineNestedLoopJoin::Operation<duckdb::uhugeint_t,duckdb::LessThanEquals>
                        (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                         current_match_count);
    }
    else {
      if (PVar1 != INT128) goto switchD_017befe5_caseD_a;
      iVar2 = RefineNestedLoopJoin::Operation<duckdb::hugeint_t,duckdb::LessThanEquals>
                        (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                         current_match_count);
    }
    break;
  case COMPARE_GREATERTHANOREQUALTO:
    PVar1 = (left->type).physical_type_;
    if (PVar1 < VARCHAR) {
      switch(PVar1) {
      case BOOL:
      case INT8:
        iVar2 = RefineNestedLoopJoin::Operation<signed_char,duckdb::GreaterThanEquals>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
        break;
      case UINT8:
        iVar2 = RefineNestedLoopJoin::Operation<unsigned_char,duckdb::GreaterThanEquals>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
        break;
      case UINT16:
        iVar2 = RefineNestedLoopJoin::Operation<unsigned_short,duckdb::GreaterThanEquals>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
        break;
      case INT16:
        iVar2 = RefineNestedLoopJoin::Operation<short,duckdb::GreaterThanEquals>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
        break;
      case UINT32:
        iVar2 = RefineNestedLoopJoin::Operation<unsigned_int,duckdb::GreaterThanEquals>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
        break;
      case INT32:
        iVar2 = RefineNestedLoopJoin::Operation<int,duckdb::GreaterThanEquals>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
        break;
      case UINT64:
        iVar2 = RefineNestedLoopJoin::Operation<unsigned_long,duckdb::GreaterThanEquals>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
        break;
      case INT64:
        iVar2 = RefineNestedLoopJoin::Operation<long,duckdb::GreaterThanEquals>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
        break;
      default:
switchD_017bf061_caseD_a:
        pIVar3 = (InternalException *)__cxa_allocate_exception(0x10);
        local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_40,"Unimplemented type for join!","");
        InternalException::InternalException(pIVar3,&local_40);
        __cxa_throw(pIVar3,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      case FLOAT:
        iVar2 = RefineNestedLoopJoin::Operation<float,duckdb::GreaterThanEquals>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
        break;
      case DOUBLE:
        iVar2 = RefineNestedLoopJoin::Operation<double,duckdb::GreaterThanEquals>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
        break;
      case INTERVAL:
        iVar2 = RefineNestedLoopJoin::Operation<duckdb::interval_t,duckdb::GreaterThanEquals>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
      }
    }
    else if (PVar1 == VARCHAR) {
      iVar2 = RefineNestedLoopJoin::Operation<duckdb::string_t,duckdb::GreaterThanEquals>
                        (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                         current_match_count);
    }
    else if (PVar1 == UINT128) {
      iVar2 = RefineNestedLoopJoin::Operation<duckdb::uhugeint_t,duckdb::GreaterThanEquals>
                        (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                         current_match_count);
    }
    else {
      if (PVar1 != INT128) goto switchD_017bf061_caseD_a;
      iVar2 = RefineNestedLoopJoin::Operation<duckdb::hugeint_t,duckdb::GreaterThanEquals>
                        (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                         current_match_count);
    }
    break;
  default:
    this = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"Unimplemented comparison type for join!","");
    NotImplementedException::NotImplementedException(this,&local_40);
    __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case COMPARE_DISTINCT_FROM:
    PVar1 = (left->type).physical_type_;
    if (PVar1 < VARCHAR) {
      switch(PVar1) {
      case BOOL:
      case INT8:
        iVar2 = RefineNestedLoopJoin::Operation<signed_char,duckdb::DistinctFrom>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
        break;
      case UINT8:
        iVar2 = RefineNestedLoopJoin::Operation<unsigned_char,duckdb::DistinctFrom>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
        break;
      case UINT16:
        iVar2 = RefineNestedLoopJoin::Operation<unsigned_short,duckdb::DistinctFrom>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
        break;
      case INT16:
        iVar2 = RefineNestedLoopJoin::Operation<short,duckdb::DistinctFrom>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
        break;
      case UINT32:
        iVar2 = RefineNestedLoopJoin::Operation<unsigned_int,duckdb::DistinctFrom>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
        break;
      case INT32:
        iVar2 = RefineNestedLoopJoin::Operation<int,duckdb::DistinctFrom>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
        break;
      case UINT64:
        iVar2 = RefineNestedLoopJoin::Operation<unsigned_long,duckdb::DistinctFrom>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
        break;
      case INT64:
        iVar2 = RefineNestedLoopJoin::Operation<long,duckdb::DistinctFrom>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
        break;
      default:
switchD_017bf11b_caseD_a:
        pIVar3 = (InternalException *)__cxa_allocate_exception(0x10);
        local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_40,"Unimplemented type for join!","");
        InternalException::InternalException(pIVar3,&local_40);
        __cxa_throw(pIVar3,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      case FLOAT:
        iVar2 = RefineNestedLoopJoin::Operation<float,duckdb::DistinctFrom>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
        break;
      case DOUBLE:
        iVar2 = RefineNestedLoopJoin::Operation<double,duckdb::DistinctFrom>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
        break;
      case INTERVAL:
        iVar2 = RefineNestedLoopJoin::Operation<duckdb::interval_t,duckdb::DistinctFrom>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
      }
    }
    else {
      if (PVar1 == VARCHAR) {
        iVar2 = RefineNestedLoopJoin::Operation<duckdb::string_t,duckdb::DistinctFrom>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
        return iVar2;
      }
      if (PVar1 == UINT128) {
        iVar2 = RefineNestedLoopJoin::Operation<duckdb::uhugeint_t,duckdb::DistinctFrom>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
      }
      else {
        if (PVar1 != INT128) goto switchD_017bf11b_caseD_a;
        iVar2 = RefineNestedLoopJoin::Operation<duckdb::hugeint_t,duckdb::DistinctFrom>
                          (left,right,left_size,right_size,lpos,rpos,lvector,rvector,
                           current_match_count);
      }
    }
  }
  return iVar2;
}

Assistant:

idx_t NestedLoopJoinComparisonSwitch(Vector &left, Vector &right, idx_t left_size, idx_t right_size, idx_t &lpos,
                                     idx_t &rpos, SelectionVector &lvector, SelectionVector &rvector,
                                     idx_t current_match_count, ExpressionType comparison_type) {
	D_ASSERT(left.GetType() == right.GetType());
	switch (comparison_type) {
	case ExpressionType::COMPARE_EQUAL:
		return NestedLoopJoinTypeSwitch<NLTYPE, Equals>(left, right, left_size, right_size, lpos, rpos, lvector,
		                                                rvector, current_match_count);
	case ExpressionType::COMPARE_NOTEQUAL:
		return NestedLoopJoinTypeSwitch<NLTYPE, NotEquals>(left, right, left_size, right_size, lpos, rpos, lvector,
		                                                   rvector, current_match_count);
	case ExpressionType::COMPARE_LESSTHAN:
		return NestedLoopJoinTypeSwitch<NLTYPE, LessThan>(left, right, left_size, right_size, lpos, rpos, lvector,
		                                                  rvector, current_match_count);
	case ExpressionType::COMPARE_GREATERTHAN:
		return NestedLoopJoinTypeSwitch<NLTYPE, GreaterThan>(left, right, left_size, right_size, lpos, rpos, lvector,
		                                                     rvector, current_match_count);
	case ExpressionType::COMPARE_LESSTHANOREQUALTO:
		return NestedLoopJoinTypeSwitch<NLTYPE, LessThanEquals>(left, right, left_size, right_size, lpos, rpos, lvector,
		                                                        rvector, current_match_count);
	case ExpressionType::COMPARE_GREATERTHANOREQUALTO:
		return NestedLoopJoinTypeSwitch<NLTYPE, GreaterThanEquals>(left, right, left_size, right_size, lpos, rpos,
		                                                           lvector, rvector, current_match_count);
	case ExpressionType::COMPARE_DISTINCT_FROM:
		return NestedLoopJoinTypeSwitch<NLTYPE, DistinctFrom>(left, right, left_size, right_size, lpos, rpos, lvector,
		                                                      rvector, current_match_count);
	default:
		throw NotImplementedException("Unimplemented comparison type for join!");
	}
}